

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

void __thiscall
cppcms::impl::tcp_cache_service::server::server
          (server *this,
          vector<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
          *io,string *ip,int port,intrusive_ptr<cppcms::impl::base_cache> *c,
          shared_ptr<cppcms::sessions::session_storage_factory> *f)

{
  base_cache *pbVar1;
  pointer psVar2;
  undefined4 uVar3;
  long lVar4;
  ulong uVar5;
  endpoint ep;
  
  booster::aio::acceptor::acceptor
            (&this->acceptor_,
             (((io->
               super__Vector_base<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<booster::aio::io_service,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  this->counter = 0;
  pbVar1 = c->p_;
  (this->cache_).p_ = pbVar1;
  if (pbVar1 != (base_cache *)0x0) {
    (*pbVar1->_vptr_base_cache[6])();
  }
  (this->services_).
  super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->services_).
  super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->services_).
  super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->sessions_).
                super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
               ,&f->
                 super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
              );
  std::vector<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>::resize
            (&this->services_,
             (long)(io->
                   super__Vector_base<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(io->
                   super__Vector_base<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar4 = 0;
  for (uVar5 = 0;
      psVar2 = (io->
               super__Vector_base<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(io->
                            super__Vector_base<std::shared_ptr<booster::aio::io_service>,_std::allocator<std::shared_ptr<booster::aio::io_service>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4);
      uVar5 = uVar5 + 1) {
    *(undefined8 *)
     ((long)(this->services_).
            super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar4) =
         *(undefined8 *)
          ((long)&(psVar2->super___shared_ptr<booster::aio::io_service,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr + lVar4 * 2);
    lVar4 = lVar4 + 8;
  }
  booster::aio::endpoint::endpoint(&ep,(string *)ip,port);
  uVar3 = booster::aio::endpoint::family();
  booster::aio::acceptor::open(this,uVar3);
  booster::aio::basic_socket::set_option(this,2,1);
  booster::aio::acceptor::bind((endpoint *)this);
  booster::aio::acceptor::listen((int)this);
  start_accept(this);
  booster::aio::endpoint::~endpoint(&ep);
  return;
}

Assistant:

server(		std::vector<booster::shared_ptr<io::io_service> > &io,
			std::string ip,
			int port,
			booster::intrusive_ptr<cppcms::impl::base_cache> c,
			booster::shared_ptr<cppcms::sessions::session_storage_factory> f
		):
		acceptor_(*io[0]),
		counter(0),
		cache_(c),
		sessions_(f)
	{
		services_.resize(io.size());
		for(size_t i=0;i<io.size();i++)
			services_[i] = io[i].get();
		io::endpoint ep(ip,port);
		acceptor_.open(ep.family());
        #ifndef CPPCMS_WIN32
		acceptor_.set_option(io::basic_socket::reuse_address,true);
        #endif
		acceptor_.bind(ep);
		acceptor_.listen(10);
		start_accept();
	}